

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zfgmr.c
# Opt level: O1

int zfgmr(int n,_func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *zmatvec,
         _func_void_int_doublecomplex_ptr_doublecomplex_ptr *zpsolve,doublecomplex *rhs,
         doublecomplex *sol,double tol,int im,int *itmax,FILE *fits)

{
  ulong uVar1;
  integer *incx;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  void *addr;
  bool bVar8;
  long *addr_00;
  doublecomplex *pdVar9;
  void *addr_01;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  double *pdVar13;
  long lVar14;
  size_t n_00;
  long lVar15;
  doublecomplex *pdVar16;
  int iVar17;
  size_t n_01;
  ulong uVar18;
  long lVar19;
  double dVar20;
  undefined4 in_register_0000008c;
  int j;
  ulong uVar21;
  double *pdVar22;
  double dVar23;
  doublereal dVar24;
  doublecomplex negt;
  int i_2;
  int i_1;
  uint local_fc;
  double local_f8;
  void *local_f0;
  ulong local_e8;
  ulong local_e0;
  doublecomplex *local_d8;
  uint local_cc;
  doublecomplex local_c8;
  ulong local_b8;
  doublecomplex *local_b0;
  doublecomplex *local_a8;
  ulong local_a0;
  double local_98;
  double local_90;
  _func_void_doublecomplex_doublecomplex_ptr_doublecomplex_doublecomplex_ptr *local_88;
  uint local_7c;
  integer local_78 [2];
  ulong local_70;
  doublecomplex *local_68;
  doublecomplex *local_60;
  ulong local_58;
  void *local_50;
  ulong local_48;
  double *local_40;
  _func_void_int_doublecomplex_ptr_doublecomplex_ptr *local_38;
  
  local_e0 = CONCAT44(in_register_0000008c,im);
  local_b8 = (ulong)(uint)*itmax;
  local_78[1] = 1;
  local_78[0] = 2;
  n_00 = (size_t)im;
  local_fc = n;
  local_98 = tol;
  local_88 = zmatvec;
  local_68 = rhs;
  local_60 = sol;
  local_38 = zpsolve;
  addr_00 = (long *)superlu_malloc(n_00 * 8 + 8);
  if (-1 < im) {
    iVar17 = (int)local_e0;
    uVar21 = 0;
    do {
      pdVar9 = doublecomplexMalloc((long)(int)local_fc);
      addr_00[uVar21] = (long)pdVar9;
      uVar21 = uVar21 + 1;
    } while (iVar17 + 1 != uVar21);
  }
  local_f8 = (double)(n_00 + 1);
  addr_01 = superlu_malloc(n_00 * 8);
  local_f0 = superlu_malloc(n_00 * 8);
  uVar21 = local_e0 & 0xffffffff;
  local_70 = uVar21;
  if (0 < (int)local_e0) {
    n_01 = 2;
    do {
      pdVar9 = doublecomplexMalloc(n_01);
      *(doublecomplex **)((long)local_f0 + n_01 * 8 + -0x10) = pdVar9;
      pdVar9 = doublecomplexMalloc((long)(int)local_fc);
      *(doublecomplex **)((long)addr_01 + n_01 * 8 + -0x10) = pdVar9;
      lVar15 = n_01 - uVar21;
      n_01 = n_01 + 1;
    } while (lVar15 != 1);
  }
  local_a8 = doublecomplexMalloc(n_00);
  local_b0 = doublecomplexMalloc(n_00);
  local_d8 = doublecomplexMalloc((size_t)local_f8);
  local_7c = (int)local_b8 + 10;
  local_e8 = 0;
  local_48 = 0;
  if (0 < (int)local_e0) {
    local_48 = local_e0 & 0xffffffff;
  }
  local_40 = &local_d8[1].i;
  incx = local_78 + 1;
  local_90 = 0.0;
  pdVar16 = local_60;
  pdVar9 = local_68;
  local_50 = addr_01;
  do {
    (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),pdVar16,(doublecomplex)ZEXT816(0),
                (doublecomplex *)*addr_00);
    if (0 < (long)(int)local_fc) {
      lVar15 = *addr_00;
      lVar14 = 0;
      do {
        *(double *)(lVar15 + lVar14) =
             *(double *)((long)&pdVar9->r + lVar14) - *(double *)(lVar15 + lVar14);
        *(double *)(lVar15 + 8 + lVar14) =
             *(double *)((long)&pdVar9->i + lVar14) - *(double *)(lVar15 + 8 + lVar14);
        lVar14 = lVar14 + 0x10;
      } while ((long)(int)local_fc * 0x10 != lVar14);
    }
    local_f8 = dznrm2_((integer *)&local_fc,(doublecomplex *)*addr_00,incx);
    if ((fits != (FILE *)0x0) && ((int)local_e8 == 0)) {
      fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(local_f8,0),0);
    }
    dVar24 = dznrm2_((integer *)&local_fc,pdVar9,incx);
    if (local_f8 <= dVar24 * local_98) {
      bVar8 = false;
    }
    else {
      if (0 < (long)(int)local_fc) {
        lVar15 = *addr_00;
        lVar14 = 0;
        do {
          *(double *)(lVar15 + lVar14) = *(double *)(lVar15 + lVar14) * (1.0 / local_f8);
          *(double *)(lVar15 + 8 + lVar14) = *(double *)(lVar15 + 8 + lVar14) * (1.0 / local_f8);
          lVar14 = lVar14 + 0x10;
        } while ((long)(int)local_fc * 0x10 != lVar14);
      }
      if ((int)local_e8 == 0) {
        local_90 = local_f8 * local_98;
      }
      local_d8->r = local_f8;
      local_d8->i = 0.0;
      lVar15 = 1;
      uVar10 = 0;
      uVar21 = 0;
      do {
        uVar18 = local_48;
        if (uVar21 == local_48) break;
        local_a0 = uVar10;
        if (local_38 == (_func_void_int_doublecomplex_ptr_doublecomplex_ptr *)0x0) {
          zcopy_((integer *)&local_fc,(doublecomplex *)addr_00[uVar21],incx,
                 *(doublecomplex **)((long)addr_01 + uVar21 * 8),incx);
        }
        else {
          (*local_38)(local_fc,*(doublecomplex **)((long)addr_01 + uVar21 * 8),
                      (doublecomplex *)addr_00[uVar21]);
        }
        local_e8 = (ulong)((int)local_e8 + 1);
        uVar1 = uVar21 + 1;
        (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),
                    *(doublecomplex **)((long)addr_01 + uVar21 * 8),(doublecomplex)ZEXT816(0),
                    (doublecomplex *)addr_00[uVar1]);
        local_f8 = dznrm2_((integer *)&local_fc,(doublecomplex *)addr_00[uVar1],incx);
        lVar14 = 0;
        do {
          if ((long)(int)local_fc < 1) {
            dVar20 = 0.0;
            dVar23 = 0.0;
          }
          else {
            dVar23 = 0.0;
            lVar19 = 0;
            dVar20 = 0.0;
            do {
              dVar2 = *(double *)(addr_00[lVar14] + lVar19);
              dVar3 = *(double *)(addr_00[lVar14] + 8 + lVar19);
              dVar4 = *(double *)(addr_00[uVar1] + lVar19);
              dVar5 = *(double *)(addr_00[uVar1] + 8 + lVar19);
              dVar20 = dVar20 + dVar2 * dVar4 + dVar3 * dVar5;
              dVar23 = dVar23 + (dVar2 * dVar5 - dVar3 * dVar4);
              lVar19 = lVar19 + 0x10;
            } while ((long)(int)local_fc * 0x10 != lVar19);
          }
          lVar19 = *(long *)((long)local_f0 + uVar21 * 8);
          *(double *)(lVar19 + lVar14 * 0x10) = dVar20;
          *(double *)(lVar19 + 8 + lVar14 * 0x10) = dVar23;
          local_c8.i._0_4_ = SUB84(dVar23,0);
          local_c8.r = -dVar20;
          local_c8.i._4_4_ = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
          zaxpy_((integer *)&local_fc,&local_c8,(doublecomplex *)addr_00[lVar14],incx,
                 (doublecomplex *)addr_00[uVar1],incx);
          lVar14 = lVar14 + 1;
        } while (lVar14 != lVar15);
        dVar24 = dznrm2_((integer *)&local_fc,(doublecomplex *)addr_00[uVar1],incx);
        if (dVar24 < local_f8 * 0.5) {
          do {
            lVar14 = 0;
            local_f8 = dVar24;
            do {
              if ((long)(int)local_fc < 1) {
                dVar20 = 0.0;
                dVar23 = 0.0;
              }
              else {
                dVar23 = 0.0;
                lVar19 = 0;
                dVar20 = 0.0;
                do {
                  dVar2 = *(double *)(addr_00[lVar14] + lVar19);
                  dVar3 = *(double *)(addr_00[lVar14] + 8 + lVar19);
                  dVar4 = *(double *)(addr_00[uVar1] + lVar19);
                  dVar5 = *(double *)(addr_00[uVar1] + 8 + lVar19);
                  dVar20 = dVar20 + dVar2 * dVar4 + dVar3 * dVar5;
                  dVar23 = dVar23 + (dVar2 * dVar5 - dVar3 * dVar4);
                  lVar19 = lVar19 + 0x10;
                } while ((long)(int)local_fc * 0x10 != lVar19);
              }
              lVar19 = *(long *)((long)local_f0 + uVar21 * 8);
              lVar12 = lVar14 * 0x10;
              *(double *)(lVar19 + lVar12) = *(double *)(lVar19 + lVar12) + dVar20;
              *(double *)(lVar19 + 8 + lVar12) = dVar23 + *(double *)(lVar19 + 8 + lVar12);
              local_c8.i._0_4_ = SUB84(dVar23,0);
              local_c8.r = -dVar20;
              local_c8.i._4_4_ = (uint)((ulong)dVar23 >> 0x20) ^ 0x80000000;
              zaxpy_((integer *)&local_fc,&local_c8,(doublecomplex *)addr_00[lVar14],incx,
                     (doublecomplex *)addr_00[uVar1],incx);
              lVar14 = lVar14 + 1;
            } while (lVar14 != lVar15);
            dVar24 = dznrm2_((integer *)&local_fc,(doublecomplex *)addr_00[uVar1],incx);
          } while (dVar24 < local_f8 * 0.5);
        }
        lVar14 = *(long *)((long)local_f0 + uVar21 * 8);
        local_f8 = (double)(uVar1 * 0x10);
        *(doublereal *)(lVar14 + (long)local_f8) = dVar24;
        *(undefined8 *)(lVar14 + 8 + (long)local_f8) = 0;
        if (((dVar24 != 0.0) || (NAN(dVar24))) && (0 < (long)(int)local_fc)) {
          lVar19 = addr_00[uVar1];
          lVar12 = 0;
          do {
            *(double *)(lVar19 + lVar12) = *(double *)(lVar19 + lVar12) * (1.0 / dVar24);
            *(double *)(lVar19 + 8 + lVar12) = *(double *)(lVar19 + 8 + lVar12) * (1.0 / dVar24);
            lVar12 = lVar12 + 0x10;
          } while ((long)(int)local_fc * 0x10 != lVar12);
        }
        if (uVar21 != 0) {
          uVar10 = 0;
          do {
            dVar20 = *(double *)(lVar14 + uVar10);
            dVar23 = *(double *)(lVar14 + 8 + uVar10);
            dVar2 = *(double *)((long)&local_a8->r + uVar10);
            dVar3 = *(double *)((long)&local_a8->i + uVar10);
            dVar4 = *(double *)(lVar14 + 0x10 + uVar10);
            dVar5 = *(double *)((long)&local_b0->r + uVar10);
            dVar6 = *(double *)((long)&local_b0->i + uVar10);
            dVar7 = *(double *)(lVar14 + 0x18 + uVar10);
            *(double *)(lVar14 + uVar10) =
                 (dVar5 * dVar4 - dVar7 * dVar6) + (dVar2 * dVar20 - dVar23 * dVar3);
            *(double *)(lVar14 + 8 + uVar10) =
                 dVar6 * dVar4 + dVar5 * dVar7 + dVar3 * dVar20 + dVar23 * dVar2;
            dVar2 = *(double *)((long)&local_b0->r + uVar10);
            dVar3 = *(double *)((long)&local_b0->i + uVar10);
            dVar5 = *(double *)((long)&local_a8->r + uVar10);
            dVar6 = *(double *)((long)&local_a8->i + uVar10);
            *(double *)(lVar14 + 0x10 + uVar10) =
                 (dVar5 * dVar4 - dVar7 * dVar6) - (dVar2 * dVar20 - dVar23 * dVar3);
            *(double *)(lVar14 + 0x18 + uVar10) =
                 (dVar6 * dVar4 + dVar7 * dVar5) - (dVar3 * dVar20 + dVar23 * dVar2);
            uVar10 = uVar10 + 0x10;
          } while (local_a0 != uVar10);
        }
        lVar19 = uVar21 * 0x10;
        dVar24 = dznrm2_(local_78,(doublecomplex *)(lVar14 + lVar19),incx);
        if ((dVar24 != 0.0) || (NAN(dVar24))) {
          dVar20 = 1.0 / dVar24;
          lVar14 = *(long *)((long)local_f0 + uVar21 * 8);
          local_a8[uVar21].r = *(double *)(lVar14 + lVar19) * dVar20;
          local_a8[uVar21].i = *(double *)(lVar14 + 8 + lVar19) * dVar20;
          local_b0[uVar21].r = *(double *)(lVar14 + (long)local_f8) * dVar20;
          local_b0[uVar21].i = dVar20 * *(double *)(lVar14 + 8 + (long)local_f8);
        }
        else {
          local_a8[uVar21].r = 1.0;
          local_a8[uVar21].i = 0.0;
          local_b0[uVar21].r = 0.0;
          local_b0[uVar21].i = 0.0;
        }
        dVar20 = local_b0[uVar21].r;
        dVar23 = local_b0[uVar21].i;
        dVar2 = local_d8[uVar21].r;
        dVar3 = local_d8[uVar21].i;
        pdVar22 = (double *)((long)&local_d8->r + (long)local_f8);
        *pdVar22 = -(dVar20 * dVar2 - dVar3 * dVar23);
        pdVar22[1] = -(dVar23 * dVar2 + dVar20 * dVar3);
        dVar20 = local_a8[uVar21].r;
        dVar23 = local_a8[uVar21].i;
        local_d8[uVar21].r = dVar20 * dVar2 - dVar3 * dVar23;
        local_d8[uVar21].i = dVar23 * dVar2 + dVar3 * dVar20;
        lVar14 = *(long *)((long)local_f0 + uVar21 * 8);
        dVar20 = local_a8[uVar21].r;
        dVar23 = local_a8[uVar21].i;
        dVar2 = *(double *)(lVar14 + lVar19);
        dVar3 = *(double *)(lVar14 + 8 + lVar19);
        dVar4 = local_b0[uVar21].r;
        dVar5 = local_b0[uVar21].i;
        dVar6 = *(double *)(lVar14 + (long)local_f8);
        dVar7 = *(double *)(lVar14 + 8 + (long)local_f8);
        *(double *)(lVar14 + lVar19) =
             (dVar4 * dVar6 - dVar7 * dVar5) + (dVar20 * dVar2 - dVar3 * dVar23);
        *(double *)(lVar14 + 8 + lVar19) =
             dVar5 * dVar6 + dVar4 * dVar7 + dVar23 * dVar2 + dVar20 * dVar3;
        dVar20 = z_abs1((doublecomplex *)((long)&local_d8->r + (long)local_f8));
        if (fits != (FILE *)0x0) {
          local_f8 = dVar20;
          fprintf((FILE *)fits,"%8d   %10.2e\n",SUB84(dVar20,0),local_e8);
          dVar20 = local_f8;
        }
        uVar18 = uVar21;
        if (dVar20 <= local_90) break;
        lVar15 = lVar15 + 1;
        uVar10 = local_a0 + 0x10;
        addr_01 = local_50;
        uVar21 = uVar1;
      } while ((int)local_e8 < (int)local_b8);
      iVar17 = (int)uVar18;
      uVar11 = iVar17 - (uint)(iVar17 == (int)local_e0);
      local_58 = (ulong)-(uint)(iVar17 == (int)local_e0);
      lVar15 = (long)(int)uVar11;
      local_cc = uVar11;
      z_div(local_d8 + lVar15,local_d8 + lVar15,
            (doublecomplex *)(lVar15 * 0x10 + *(long *)((long)local_f0 + lVar15 * 8)));
      if (0 < (int)uVar11) {
        dVar20 = (double)((uVar18 & 0xffffffff) + ~(ulong)(iVar17 == (int)local_e0));
        uVar21 = (ulong)local_cc;
        local_a0 = (ulong)((int)local_58 + iVar17 + 1);
        pdVar22 = local_40 + (long)dVar20 * 2;
        uVar10 = 1;
        do {
          lVar15 = uVar21 - uVar10;
          lVar14 = lVar15 * 0x10;
          local_c8.r = local_d8[lVar15].r;
          local_c8.i = local_d8[lVar15].i;
          pdVar13 = pdVar22;
          dVar23 = dVar20;
          do {
            lVar19 = *(long *)((long)local_f0 + (long)dVar23 * 8 + 8);
            dVar23 = (double)((long)dVar23 + 1);
            dVar2 = *(double *)(lVar19 + lVar14);
            dVar3 = *(double *)(lVar19 + 8 + lVar14);
            local_c8.r = local_c8.r -
                         (dVar2 * ((doublecomplex *)(pdVar13 + -1))->r - *pdVar13 * dVar3);
            local_c8.i = local_c8.i -
                         (dVar3 * ((doublecomplex *)(pdVar13 + -1))->r + dVar2 * *pdVar13);
            pdVar13 = pdVar13 + 2;
          } while ((long)dVar23 < (long)uVar21);
          local_f8 = dVar20;
          z_div(local_d8 + lVar15,&local_c8,
                (doublecomplex *)(lVar14 + *(long *)((long)local_f0 + lVar15 * 8)));
          uVar10 = uVar10 + 1;
          dVar20 = (double)((long)local_f8 + -1);
          pdVar22 = pdVar22 + -2;
        } while (uVar10 != local_a0);
      }
      addr_01 = local_50;
      pdVar16 = local_60;
      pdVar9 = local_68;
      if (-1 < (int)local_cc) {
        uVar21 = 0;
        do {
          if (0 < (int)local_fc) {
            dVar20 = local_d8[uVar21].r;
            dVar23 = local_d8[uVar21].i;
            lVar15 = *(long *)((long)local_50 + uVar21 * 8);
            lVar14 = 0;
            do {
              dVar2 = *(double *)(lVar15 + lVar14);
              dVar3 = *(double *)(lVar15 + 8 + lVar14);
              *(double *)((long)&local_60->r + lVar14) =
                   dVar20 * dVar2 + dVar3 * -dVar23 + *(double *)((long)&local_60->r + lVar14);
              *(double *)((long)&local_60->i + lVar14) =
                   dVar2 * dVar23 + dVar3 * dVar20 + *(double *)((long)&local_60->i + lVar14);
              lVar14 = lVar14 + 0x10;
            } while ((ulong)local_fc << 4 != lVar14);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 != (int)local_58 + iVar17 + 1);
      }
      (*local_88)((doublecomplex)ZEXT816(0x3ff0000000000000),local_60,(doublecomplex)ZEXT816(0),
                  (doublecomplex *)*addr_00);
      if (0 < (long)(int)local_fc) {
        lVar15 = *addr_00;
        lVar14 = 0;
        do {
          *(double *)(lVar15 + lVar14) =
               *(double *)((long)&pdVar9->r + lVar14) - *(double *)(lVar15 + lVar14);
          *(double *)(lVar15 + 8 + lVar14) =
               *(double *)((long)&pdVar9->i + lVar14) - *(double *)(lVar15 + 8 + lVar14);
          lVar14 = lVar14 + 0x10;
        } while ((long)(int)local_fc * 0x10 != lVar14);
      }
      dVar24 = dznrm2_((integer *)&local_fc,(doublecomplex *)*addr_00,incx);
      local_e8 = local_e8 & 0xffffffff;
      if (local_90 / local_98 <= dVar24) {
        local_e8 = (ulong)local_7c;
      }
      bVar8 = dVar24 < local_90 / local_98 && local_90 < dVar24;
    }
    if ((!bVar8) || ((int)local_b8 <= (int)local_e8)) {
      if (-1 < (int)local_e0) {
        uVar11 = (int)local_e0 + 1;
        uVar21 = 0;
        do {
          superlu_free((void *)addr_00[uVar21]);
          uVar21 = uVar21 + 1;
        } while (uVar11 != uVar21);
      }
      superlu_free(addr_00);
      uVar21 = local_70;
      addr = local_f0;
      if (0 < (int)local_e0) {
        uVar10 = 0;
        do {
          superlu_free(*(void **)((long)addr + uVar10 * 8));
          superlu_free(*(void **)((long)addr_01 + uVar10 * 8));
          uVar10 = uVar10 + 1;
        } while (uVar21 != uVar10);
      }
      iVar17 = (int)local_e8;
      bVar8 = (int)local_b8 <= iVar17;
      superlu_free(addr);
      superlu_free(addr_01);
      superlu_free(local_a8);
      superlu_free(local_b0);
      superlu_free(local_d8);
      *itmax = iVar17;
      return (int)bVar8;
    }
  } while( true );
}

Assistant:

int zfgmr(int n,
     void (*zmatvec) (doublecomplex, doublecomplex[], doublecomplex, doublecomplex[]),
     void (*zpsolve) (int, doublecomplex[], doublecomplex[]),
     doublecomplex *rhs, doublecomplex *sol, double tol, int im, int *itmax, FILE * fits)
{
/*----------------------------------------------------------------------
|                 *** Preconditioned FGMRES ***
+-----------------------------------------------------------------------
| This is a simple version of the ARMS preconditioned FGMRES algorithm.
+-----------------------------------------------------------------------
| Y. S. Dec. 2000. -- Apr. 2008
+-----------------------------------------------------------------------
| on entry:
|----------
|
| rhs     = real vector of length n containing the right hand side.
| sol     = real vector of length n containing an initial guess to the
|           solution on input.
| tol     = tolerance for stopping iteration
| im      = Krylov subspace dimension
| (itmax) = max number of iterations allowed.
| fits    = NULL: no output
|        != NULL: file handle to output " resid vs time and its"
|
| on return:
|----------
| fgmr      int =  0 --> successful return.
|           int =  1 --> convergence not achieved in itmax iterations.
| sol     = contains an approximate solution (upon successful return).
| itmax   = has changed. It now contains the number of steps required
|           to converge --
+-----------------------------------------------------------------------
| internal work arrays:
|----------
| vv      = work array of length [im+1][n] (used to store the Arnoldi
|           basis)
| hh      = work array of length [im][im+1] (Householder matrix)
| z       = work array of length [im][n] to store preconditioned vectors
+-----------------------------------------------------------------------
| subroutines called :
| matvec - matrix-vector multiplication operation
| psolve - (right) preconditioning operation
|	   psolve can be a NULL pointer (GMRES without preconditioner)
+---------------------------------------------------------------------*/

    int maxits = *itmax;
    int its, i_1 = 1, i_2 = 2;
    double eps1 = 0.0;
    doublecomplex **hh, *c, *s, *rs;
    doublecomplex **vv, **z;
    doublecomplex zero = {0.0, 0.0};
    doublecomplex one = {1.0, 0.0};
    doublecomplex tt1, tt2;

    its = 0;
    vv = (doublecomplex **)SUPERLU_MALLOC((im + 1) * sizeof(doublecomplex *));
    for (int i = 0; i <= im; i++) vv[i] = doublecomplexMalloc(n);
    z = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    hh = (doublecomplex **)SUPERLU_MALLOC(im * sizeof(doublecomplex *));
    for (int i = 0; i < im; i++)
    {
	hh[i] = doublecomplexMalloc(i + 2);
	z[i] = doublecomplexMalloc(n);
    }
    c = doublecomplexMalloc(im);
    s = doublecomplexMalloc(im);
    rs = doublecomplexMalloc(im + 1);

    /*---- outer loop starts here ----*/
    do
    {
	/*---- compute initial residual vector ----*/
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);	/* vv[0]= initial residual */
	double beta = dznrm2_(&n, vv[0], &i_1);

	/*---- print info if fits != null ----*/
	if (fits != NULL && its == 0)
	    fprintf(fits, "%8d   %10.2e\n", its, beta);
	/*if ( beta <= tol * dnrm2_(&n, rhs, &i_1) )*/
	if ( !(beta > tol * dznrm2_(&n, rhs, &i_1)) )
	    break;
	double t = 1.0 / beta;

	/*---- normalize: vv[0] = vv[0] / beta ----*/
	for (int j = 0; j < n; j++)
	    zd_mult(&vv[0][j], &vv[0][j], t);
	if (its == 0)
	    eps1 = tol * beta;

	/*---- initialize 1-st term of rhs of hessenberg system ----*/
	rs[0].r = beta;
	rs[0].i = 0.0;
	int i = 0;
	for (i = 0; i < im; i++)
	{
	    its++;
	    int i1 = i + 1;

	    /*------------------------------------------------------------
	    |  (Right) Preconditioning Operation   z_{j} = M^{-1} v_{j}
	    +-----------------------------------------------------------*/
	    if (zpsolve)
		zpsolve(n, z[i], vv[i]);
	    else
		zcopy_(&n, vv[i], &i_1, z[i], &i_1);

	    /*---- matvec operation w = A z_{j} = A M^{-1} v_{j} ----*/
	    zmatvec(one, z[i], zero, vv[i1]);

	    /*------------------------------------------------------------
	    |     modified gram - schmidt...
	    |     h_{i,j} = (w,v_{i})
	    |     w  = w - h_{i,j} v_{i}
	    +------------------------------------------------------------*/
	    double t0 = dznrm2_(&n, vv[i1], &i_1);
	    for (int j = 0; j <= i; j++)
	    {
		doublecomplex negt;
#if 0
		zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
		doublecomplex tt = zero;
		for (int k = 0; k < n; ++k) {
		    zz_conj(&tt1, &vv[j][k]);
		    zz_mult(&tt2, &tt1, &vv[i1][k]);
		    z_add(&tt, &tt, &tt2);
		}
#endif
		hh[i][j] = tt;
		negt.r = -tt.r;
		negt.i = -tt.i;
		zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
	    }

	    /*---- h_{j+1,j} = ||w||_{2} ----*/
	    t = dznrm2_(&n, vv[i1], &i_1);
	    while (t < 0.5 * t0)
	    {
		t0 = t;
		for (int j = 0; j <= i; j++)
		{
		    doublecomplex negt;
#if 0
		    zdotc_(&tt, &n, vv[j], &i_1, vv[i1], &i_1);
#else
   	            doublecomplex tt = zero;
		    for (int k = 0; k < n; ++k) {
		        zz_conj(&tt1, &vv[j][k]);
		        zz_mult(&tt2, &tt1, &vv[i1][k]);
		        z_add(&tt, &tt, &tt2);
		    }
#endif
		    z_add(&hh[i][j], &hh[i][j], &tt);
		    negt.r = -tt.r;
		    negt.i = -tt.i;
		    zaxpy_(&n, &negt, vv[j], &i_1, vv[i1], &i_1);
		}
		t = dznrm2_(&n, vv[i1], &i_1);
	    }

	    hh[i][i1].r = t;
	    hh[i][i1].i = 0.0;

	    if (t != 0.0)
	    {
		/*---- v_{j+1} = w / h_{j+1,j} ----*/
		t = 1.0 / t;
		for (int k = 0; k < n; k++)
	            zd_mult(&vv[i1][k], &vv[i1][k], t);
	    }
	    /*---------------------------------------------------
	    |     done with modified gram schmidt and arnoldi step
	    |     now  update factorization of hh
	    +--------------------------------------------------*/

	    /*--------------------------------------------------------
	    |   perform previous transformations  on i-th column of h
	    +-------------------------------------------------------*/
	    for (int k = 1; k <= i; k++)
	    {
		int k1 = k - 1;
		doublecomplex tt = hh[i][k1];
                zz_mult(&tt1, &c[k1], &tt);
                zz_mult(&tt2, &s[k1], &hh[i][k]);
                z_add(&hh[i][k1], &tt1, &tt2);

                zz_mult(&tt1, &s[k1], &tt);
                zz_mult(&tt2, &c[k1], &hh[i][k]);
                z_sub(&hh[i][k], &tt2, &tt1);
	    }

	    double gam = dznrm2_(&i_2, &hh[i][i], &i_1);

	    /*---------------------------------------------------
	    |     if gamma is zero then any small value will do
	    |     affect only residual estimate
	    +--------------------------------------------------*/
	    /* if (gam == 0.0) gam = epsmac; */

	    /*---- get next plane rotation ---*/
	    if (gam == 0.0)
	    {
		c[i] = one;
		s[i] = zero;
	    }
            else
	    {
                gam = 1.0 / gam;
		zd_mult(&c[i], &hh[i][i], gam);
		zd_mult(&s[i], &hh[i][i1], gam);
	    }

	    zz_mult(&rs[i1], &s[i], &rs[i]);
            rs[i1].r = -rs[i1].r;  rs[i1].i = -rs[i1].i;
	    zz_mult(&rs[i], &c[i], &rs[i]);

	    /*----------------------------------------------------
	    |   determine residual norm and test for convergence
	    +---------------------------------------------------*/
            zz_mult(&tt1, &c[i], &hh[i][i]);
            zz_mult(&tt2, &s[i], &hh[i][i1]);
            z_add(&hh[i][i], &tt1, &tt2);
            beta = z_abs1(&rs[i1]);
	    if (fits != NULL)
		fprintf(fits, "%8d   %10.2e\n", its, beta);
	    if (beta <= eps1 || its >= maxits)
		break;
	}

	if (i == im) i--;

	/*---- now compute solution. 1st, solve upper triangular system ----*/
	z_div(&rs[i], &rs[i], &hh[i][i]);

	for (int ii = 1; ii <= i; ii++)
	{
	    int k = i - ii;
	    doublecomplex tt = rs[k];
	    for (int j = k + 1; j <= i; j++) {
                zz_mult(&tt1, &hh[j][k], &rs[j]);
		z_sub(&tt, &tt, &tt1);
            }
            z_div(&rs[k], &tt, &hh[k][k]);
	}

	/*---- linear combination of v[i]'s to get sol. ----*/
	for (int j = 0; j <= i; j++)
	{
	    doublecomplex tt = rs[j];
	    for (int k = 0; k < n; k++) {
                zz_mult(&tt1, &tt, &z[j][k]);
		z_add(&sol[k], &sol[k], &tt1);
            }
	}

	/* calculate the residual and output */
	zmatvec(one, sol, zero, vv[0]);
	for (int j = 0; j < n; j++)
	    z_sub(&vv[0][j], &rhs[j], &vv[0][j]);/* vv[0]= initial residual */

	/*---- print info if fits != null ----*/
	beta = dznrm2_(&n, vv[0], &i_1);

	/*---- restart outer loop if needed ----*/
	/*if (beta >= eps1 / tol)*/
	if ( !(beta < eps1 / tol) )
	{
	    its = maxits + 10;
	    break;
	}
	if (beta <= eps1)
	    break;
    } while(its < maxits);

    int retval = (its >= maxits);
    for (int i = 0; i <= im; i++)
	SUPERLU_FREE(vv[i]);
    SUPERLU_FREE(vv);
    for (int i = 0; i < im; i++)
    {
	SUPERLU_FREE(hh[i]);
	SUPERLU_FREE(z[i]);
    }
    SUPERLU_FREE(hh);
    SUPERLU_FREE(z);
    SUPERLU_FREE(c);
    SUPERLU_FREE(s);
    SUPERLU_FREE(rs);

    *itmax = its;

    return retval;
}